

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMI_RH_NV_AUTH_Unmarshal(TPMI_RH_NV_AUTH *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  uint uVar2;
  UINT32 UVar3;
  TPM_RC TVar4;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar4 = 0x9a;
  if (3 < iVar1) {
    UVar3 = ByteArrayToUint32(*buffer);
    *target = UVar3;
    *buffer = *buffer + 4;
    uVar2 = *target;
    if (((uVar2 == 0x40000001) || (uVar2 == 0x4000000c)) ||
       (TVar4 = 0x84, (uVar2 & 0xff000000) == 0x1000000)) {
      TVar4 = 0;
    }
  }
  return TVar4;
}

Assistant:

TPM_RC
TPMI_RH_NV_AUTH_Unmarshal(TPMI_RH_NV_AUTH *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_PLATFORM:
        case TPM_RH_OWNER:
            break;
        default:
            if((*target < NV_INDEX_FIRST) || (*target > NV_INDEX_LAST))
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}